

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O3

void Ssw_SmlAddPatternDyn(Ssw_Man_t *p)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  Ssw_Sat_t *pSVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  pSVar4 = p->pMSat;
  pVVar5 = pSVar4->vUsedPis;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      piVar2 = (int *)pVVar5->pArray[lVar6];
      if ((piVar2[6] & 7U) != 2) {
        __assert_fail("Aig_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSweep.c"
                      ,0xa5,"void Ssw_SmlAddPatternDyn(Ssw_Man_t *)");
      }
      iVar3 = Ssw_ObjSatNum((Ssw_Sat_t *)pSVar4->vSatVars,(Aig_Obj_t *)(ulong)(uint)piVar2[9]);
      if (iVar3 < 1) {
        __assert_fail("nVarNum > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSweep.c"
                      ,0xa7,"void Ssw_SmlAddPatternDyn(Ssw_Man_t *)");
      }
      iVar3 = sat_solver_var_value(p->pMSat->pSat,iVar3);
      if (iVar3 != 0) {
        if (0xfffffffd < (piVar2[6] & 7U) - 7) {
          __assert_fail("!Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
        }
        iVar3 = *piVar2;
        if (((long)iVar3 < 0) || (p->vSimInfo->nSize <= iVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar1 = (uint *)((long)p->vSimInfo->pArray[iVar3] + (long)(p->nPatterns >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)p->nPatterns & 0x1f);
      }
      lVar6 = lVar6 + 1;
      pSVar4 = p->pMSat;
      pVVar5 = pSVar4->vUsedPis;
    } while (lVar6 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Ssw_SmlAddPatternDyn( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj;
    unsigned * pInfo;
    int i, nVarNum;
    // iterate through the PIs of the frames
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pMSat->vUsedPis, pObj, i )
    {
        assert( Aig_ObjIsCi(pObj) );
        nVarNum = Ssw_ObjSatNum( p->pMSat, pObj );
        assert( nVarNum > 0 );
        if ( sat_solver_var_value( p->pMSat->pSat, nVarNum ) )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObj) );
            Abc_InfoSetBit( pInfo, p->nPatterns );
        }
    }
}